

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O2

state_status_t __thiscall
tchecker::zg::standard_semantics_t::prev
          (standard_semantics_t *this,db_t *dbm,clock_id_t dim,bool src_delay_allowed,
          clock_constraint_container_t *src_invariant,clock_constraint_container_t *guard,
          clock_reset_container_t *clkreset,bool tgt_delay_allowed,
          clock_constraint_container_t *tgt_invariant)

{
  status_t sVar1;
  state_status_t sVar2;
  clock_constraint_container_t resets_as_constraints;
  
  sVar1 = tchecker::dbm::constrain(dbm,dim,tgt_invariant);
  if (sVar1 == EMPTY) {
    return 0x100;
  }
  resets_as_constraints.
  super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  resets_as_constraints.
  super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  resets_as_constraints.
  super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clock_resets_to_constraints(clkreset,&resets_as_constraints);
  sVar1 = tchecker::dbm::constrain(dbm,dim,&resets_as_constraints);
  if (sVar1 == EMPTY) {
    sVar2 = 0x200;
  }
  else {
    tchecker::dbm::free_clock(dbm,dim,clkreset);
    sVar1 = tchecker::dbm::constrain(dbm,dim,guard);
    if (sVar1 == EMPTY) {
      sVar2 = 0x40;
    }
    else {
      sVar1 = tchecker::dbm::constrain(dbm,dim,src_invariant);
      sVar2 = 0x80;
      if (sVar1 != EMPTY) {
        if (src_delay_allowed) {
          tchecker::dbm::open_down(dbm,dim);
          sVar1 = tchecker::dbm::constrain(dbm,dim,src_invariant);
          if (sVar1 == EMPTY) goto LAB_0016463c;
        }
        sVar2 = 1;
      }
    }
  }
LAB_0016463c:
  std::_Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::
  ~_Vector_base(&resets_as_constraints.
                 super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
               );
  return sVar2;
}

Assistant:

tchecker::state_status_t standard_semantics_t::prev(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim, bool src_delay_allowed,
                                                    tchecker::clock_constraint_container_t const & src_invariant,
                                                    tchecker::clock_constraint_container_t const & guard,
                                                    tchecker::clock_reset_container_t const & clkreset, bool tgt_delay_allowed,
                                                    tchecker::clock_constraint_container_t const & tgt_invariant)
{
  // prev(dbm) = free_clocks(dbm & tgt_invariant & constraints(clkreset), left_clocks(clkreset)) & guard & src_invariant
  // finally, if src_delay_allowed: opened down and intersected with src_invariant again
  if (tchecker::dbm::constrain(dbm, dim, tgt_invariant) == tchecker::dbm::EMPTY)
    return tchecker::STATE_CLOCKS_TGT_INVARIANT_VIOLATED;

  tchecker::clock_constraint_container_t resets_as_constraints;
  tchecker::clock_resets_to_constraints(clkreset, resets_as_constraints);
  if (tchecker::dbm::constrain(dbm, dim, resets_as_constraints) == tchecker::dbm::EMPTY)
    return tchecker::STATE_CLOCKS_RESET_FAILED;

  tchecker::dbm::free_clock(dbm, dim, clkreset);

  if (tchecker::dbm::constrain(dbm, dim, guard) == tchecker::dbm::EMPTY)
    return tchecker::STATE_CLOCKS_GUARD_VIOLATED;

  if (tchecker::dbm::constrain(dbm, dim, src_invariant) == tchecker::dbm::EMPTY)
    return tchecker::STATE_CLOCKS_SRC_INVARIANT_VIOLATED;

  if (src_delay_allowed) {
    tchecker::dbm::open_down(dbm, dim);

    if (tchecker::dbm::constrain(dbm, dim, src_invariant) == tchecker::dbm::EMPTY)
      return tchecker::STATE_CLOCKS_SRC_INVARIANT_VIOLATED;
  }

  return tchecker::STATE_OK;
}